

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O2

void __thiscall amrex::BoxArray::set(BoxArray *this,int i,Box *ibox)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int i_1;
  long lVar4;
  Box bx;
  undefined4 uStack_30;
  int local_2c [2];
  undefined8 uStack_24;
  
  if (i == 0) {
    BATransformer::set_index_type(&this->m_bat,(IndexType)(ibox->btype).itype);
  }
  uVar2 = *(undefined8 *)(ibox->smallend).vect;
  uVar3 = *(undefined8 *)((ibox->smallend).vect + 2);
  local_2c[1] = (int)((ulong)*(undefined8 *)(ibox->bigend).vect >> 0x20);
  uStack_24 = *(ulong *)((ibox->bigend).vect + 2);
  uStack_30 = (undefined4)uVar3;
  local_2c[0] = (int)((ulong)uVar3 >> 0x20);
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    if ((uStack_24._4_4_ >> ((uint)lVar4 & 0x1f) & 1) != 0) {
      local_2c[lVar4] = local_2c[lVar4] + -1;
    }
  }
  uStack_24 = uStack_24 & 0xffffffff;
  lVar4 = *(long *)&(((this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data;
  puVar1 = (undefined8 *)(lVar4 + 0xc + (long)i * 0x1c);
  *puVar1 = CONCAT44(local_2c[1],local_2c[0]);
  puVar1[1] = uStack_24;
  puVar1 = (undefined8 *)(lVar4 + (long)i * 0x1c);
  *puVar1 = uVar2;
  puVar1[1] = CONCAT44(local_2c[0],uStack_30);
  return;
}

Assistant:

void
BoxArray::set (int i, const Box& ibox)
{
    BL_ASSERT(m_bat.is_simple() && crseRatio() == IntVect::TheUnitVector());
    if (i == 0) {
        m_bat.set_index_type(ibox.ixType());
    }
    m_ref->m_abox[i] = amrex::enclosedCells(ibox);
}